

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farchive.cpp
# Opt level: O1

void __thiscall
FCompressedFile::FCompressedFile
          (FCompressedFile *this,FILE *file,EOpenMode mode,bool dontCompress,bool postopen)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uchar *puVar6;
  undefined3 in_register_00000081;
  char cStack_34;
  char cStack_33;
  char cStack_32;
  char cStack_31;
  uint uStack_30;
  uint uStack_2c;
  
  (this->super_FFile)._vptr_FFile = (_func_int **)&PTR__FCompressedFile_00847f68;
  this->m_Pos = 0;
  this->m_BufferSize = 0;
  this->m_MaxBufferSize = 0;
  this->m_Buffer = (uchar *)0x0;
  this->m_Mode = mode;
  this->m_File = file;
  this->m_NoCompress = dontCompress;
  if (CONCAT31(in_register_00000081,postopen) != 0) {
    if (((FILE *)this->m_File != (FILE *)0x0) && (this->m_Mode == EReading)) {
      fread(&cStack_34,4,1,(FILE *)this->m_File);
      if ((cStack_32 != 'Z' || (cStack_33 != 'L' || cStack_34 != 'F')) || cStack_31 != 'L') {
        fclose((FILE *)this->m_File);
        this->m_File = (FILE *)0x0;
        if ((cStack_32 == 'Z' && (cStack_33 == 'L' && cStack_34 == 'F')) && cStack_31 == 'O') {
          Printf("Compressed files from older ZDooms are not supported.\n");
        }
      }
      else {
        fread(&uStack_30,4,2,(FILE *)this->m_File);
        uVar4 = uStack_2c;
        uVar3 = uStack_30;
        uVar5 = uStack_30 >> 0x18 | (uStack_30 & 0xff0000) >> 8 | (uStack_30 & 0xff00) << 8 |
                uStack_30 << 0x18;
        uStack_2c = uStack_2c >> 0x18 | (uStack_2c & 0xff0000) >> 8 | (uStack_2c & 0xff00) << 8 |
                    uStack_2c << 0x18;
        uVar2 = uStack_2c;
        if (uStack_30 != 0) {
          uVar2 = uVar5;
        }
        uStack_30 = uVar5;
        puVar6 = (uchar *)M_Malloc_Dbg((ulong)(uVar2 + 8),
                                       "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/farchive.cpp"
                                       ,0xd5);
        this->m_Buffer = puVar6;
        fread(puVar6 + 8,(ulong)uVar2,1,(FILE *)this->m_File);
        puVar1 = (uint *)this->m_Buffer;
        *puVar1 = uVar3;
        puVar1[1] = uVar4;
        Explode(this);
      }
    }
    return;
  }
  return;
}

Assistant:

FCompressedFile::FCompressedFile (FILE *file, EOpenMode mode, bool dontCompress, bool postopen)
{
	BeEmpty ();
	m_Mode = mode;
	m_File = file;
	m_NoCompress = dontCompress;
	if (postopen)
	{
		PostOpen ();
	}
}